

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::calculateHOutline(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  int iVar1;
  pointer pMVar2;
  pointer pMVar3;
  Object *pOVar4;
  NewObject *this_00;
  qpdf_offset_t qVar5;
  HGeneric *ho;
  HGeneric *cho;
  ObjTable *obj_local;
  NewObjTable *new_obj_local;
  QPDF *this_local;
  
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar2->c_outline_data).nobjects != 0) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pOVar4 = ObjTable<QPDFWriter::Object>::operator[]
                       (&obj->super_ObjTable<QPDFWriter::Object>,
                        (pMVar2->c_outline_data).first_object);
    (pMVar3->outline_hints).first_object = pOVar4->renumber;
    this_00 = ObjTable<QPDFWriter::NewObject>::operator[]
                        (&new_obj->super_ObjTable<QPDFWriter::NewObject>,
                         (pMVar3->outline_hints).first_object);
    qVar5 = QPDFXRefEntry::getOffset(&this_00->xref);
    (pMVar3->outline_hints).first_object_offset = qVar5;
    (pMVar3->outline_hints).nobjects = (pMVar2->c_outline_data).nobjects;
    iVar1 = outputLengthNextN(this,(pMVar2->c_outline_data).first_object,
                              (pMVar3->outline_hints).nobjects,new_obj,obj);
    (pMVar3->outline_hints).group_length = iVar1;
  }
  return;
}

Assistant:

void
QPDF::calculateHOutline(QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    HGeneric& cho = m->c_outline_data;

    if (cho.nobjects == 0) {
        return;
    }

    HGeneric& ho = m->outline_hints;

    ho.first_object = obj[cho.first_object].renumber;
    ho.first_object_offset = new_obj[ho.first_object].xref.getOffset();
    ho.nobjects = cho.nobjects;
    ho.group_length = outputLengthNextN(cho.first_object, ho.nobjects, new_obj, obj);
}